

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampler.cc
# Opt level: O0

bool __thiscall tcmalloc::Sampler::RecordAllocationSlow(Sampler *this,size_t k)

{
  ssize_t sVar1;
  size_t k_local;
  Sampler *this_local;
  
  if ((this->initialized_ & 1U) == 0) {
    this->initialized_ = true;
    Init(this,(uint64_t)this);
    if (k <= (ulong)this->bytes_until_sample_) {
      this->bytes_until_sample_ = this->bytes_until_sample_ - k;
      return true;
    }
  }
  sVar1 = PickNextSamplingPoint(this);
  this->bytes_until_sample_ = sVar1;
  return FLAG__namespace_do_not_use_directly_use_DECLARE_int64_t_instead::
         FLAGS_tcmalloc_sample_parameter < 1;
}

Assistant:

bool Sampler::RecordAllocationSlow(size_t k) {
  if (!initialized_) {
    initialized_ = true;
    Init(reinterpret_cast<uintptr_t>(this));
    if (static_cast<size_t>(bytes_until_sample_) >= k) {
      bytes_until_sample_ -= k;
      return true;
    }
  }
  bytes_until_sample_ = PickNextSamplingPoint();
  return FLAGS_tcmalloc_sample_parameter <= 0;
}